

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite_info.hpp
# Opt level: O0

suite_info *
beast::unit_test::make_suite_info<jbcoin::tests::ValidatorKeys_test>
          (suite_info *__return_storage_ptr__,string *name,string *module,string *library,
          bool manual)

{
  byte bVar1;
  anon_class_1_0_00000001 local_b1;
  run_type local_b0;
  string local_90;
  string local_70;
  string local_50;
  byte local_29;
  string *psStack_28;
  bool manual_local;
  string *library_local;
  string *module_local;
  string *name_local;
  
  local_29 = manual;
  psStack_28 = library;
  library_local = module;
  module_local = name;
  name_local = &__return_storage_ptr__->name_;
  ::std::__cxx11::string::string((string *)&local_50,(string *)name);
  ::std::__cxx11::string::string((string *)&local_70,(string *)module);
  ::std::__cxx11::string::string((string *)&local_90,(string *)library);
  bVar1 = local_29;
  ::std::function<void(beast::unit_test::runner&)>::
  function<beast::unit_test::make_suite_info<jbcoin::tests::ValidatorKeys_test>(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,bool)::_lambda(beast::unit_test::runner&)_1_,void>
            ((function<void(beast::unit_test::runner&)> *)&local_b0,&local_b1);
  suite_info::suite_info
            (__return_storage_ptr__,&local_50,&local_70,&local_90,(bool)(bVar1 & 1),&local_b0);
  std::function<void_(beast::unit_test::runner_&)>::~function
            ((function<void_(beast::unit_test::runner_&)> *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

suite_info
make_suite_info(
    std::string name,
    std::string module,
    std::string library,
    bool manual)
{
    return suite_info(
        std::move(name),
        std::move(module),
        std::move(library),
        manual,
        [](runner& r)
        {
            Suite{}(r);
        }
    );
}